

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_lexicon.h
# Opt level: O3

uint32 __thiscall
SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::
Add<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (SequenceLexicon<int,std::hash<int>,std::equal_to<int>> *this,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end)

{
  iterator __position;
  iterator __position_00;
  long lVar1;
  uint *puVar2;
  uint32 id;
  pair<gtl::dense_hashtable_iterator<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>,_bool>
  p;
  uint local_44;
  pair<gtl::dense_hashtable_iterator<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>,_bool>
  local_40;
  
  if (begin._M_current != end._M_current) {
    do {
      __position._M_current = *(int **)(this + 8);
      if (__position._M_current == *(int **)(this + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)this,__position,begin._M_current);
      }
      else {
        *__position._M_current = *begin._M_current;
        *(int **)(this + 8) = __position._M_current + 1;
      }
      begin._M_current = begin._M_current + 1;
    } while (begin._M_current != end._M_current);
  }
  local_40.first.ht._0_4_ = (uint)((ulong)(*(long *)(this + 8) - *(long *)this) >> 2);
  __position_00._M_current = *(uint **)(this + 0x20);
  if (__position_00._M_current == *(uint **)(this + 0x28)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 0x18),__position_00,
               (uint *)&local_40);
    puVar2 = *(uint **)(this + 0x20);
  }
  else {
    *__position_00._M_current = (uint)local_40.first.ht;
    puVar2 = __position_00._M_current + 1;
    *(uint **)(this + 0x20) = puVar2;
  }
  local_44 = (int)((ulong)((long)puVar2 - *(long *)(this + 0x18)) >> 2) - 2;
  gtl::
  dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  ::resize_delta((dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
                  *)(this + 0x30),1);
  gtl::
  dense_hashtable<unsigned_int,unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::Identity,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::SetKey,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>
  ::insert_noresize<unsigned_int_const&>
            (&local_40,
             (dense_hashtable<unsigned_int,unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::Identity,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::SetKey,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>
              *)(this + 0x30),&local_44);
  puVar2 = &local_44;
  if (local_40.second == false) {
    lVar1 = *(long *)(this + 0x20);
    *(long *)(this + 0x20) = lVar1 + -4;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)this,(ulong)*(uint *)(lVar1 + -8));
    puVar2 = local_40.first.pos;
  }
  return *puVar2;
}

Assistant:

uint32 SequenceLexicon<T, Hasher, KeyEqual>::Add(FwdIterator begin,
                                                 FwdIterator end) {
  for (; begin != end; ++begin) {
    values_.push_back(*begin);
  }
  begins_.push_back(values_.size());
  uint32 id = begins_.size() - 2;
  auto result = id_set_.insert(id);
  if (result.second) {
    return id;
  } else {
    begins_.pop_back();
    values_.resize(begins_.back());
    return *result.first;
  }
}